

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubD::ComponentCount(ON_SubD *this,Type component_type)

{
  Type component_type_local;
  ON_SubD *this_local;
  
  if (component_type == Vertex) {
    this_local._4_4_ = VertexCount(this);
  }
  else if (component_type == Edge) {
    this_local._4_4_ = EdgeCount(this);
  }
  else if (component_type == Face) {
    this_local._4_4_ = FaceCount(this);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned ON_SubD::ComponentCount(
  ON_SubDComponentPtr::Type component_type
) const 
{
  switch (component_type)
  {
  case ON_SubDComponentPtr::Type::Vertex:
    return this->VertexCount();
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return this->EdgeCount();
    break;
  case ON_SubDComponentPtr::Type::Face:
    return this->FaceCount();
    break;
  default:
    break;
  }
  return 0;
}